

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O2

PartialPolicyPoolItemInterface_sharedPtr __thiscall
GMAA_MAAstarCluster::NewPPI(GMAA_MAAstarCluster *this,PJPDP_sharedPtr *jp,double v)

{
  _func_int **pp_Var1;
  shared_count sVar2;
  shared_ptr<PartialJointPolicyDiscretePure> *in_RDX;
  shared_count extraout_RDX;
  PartialPolicyPoolItemInterface_sharedPtr PVar3;
  _func_int **local_28;
  shared_count asStack_20 [2];
  double local_10;
  
  local_10 = v;
  boost::
  make_shared<PartialJPDPValuePair,boost::shared_ptr<PartialJointPolicyDiscretePure>const&,double&>
            ((boost *)&local_28,in_RDX,&local_10);
  sVar2.pi_ = asStack_20[0].pi_;
  pp_Var1 = local_28;
  asStack_20[0].pi_ = (sp_counted_base *)0x0;
  local_28 = (_func_int **)0x0;
  (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_PlanningUnitDecPOMDPDiscrete.
  super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit = pp_Var1;
  (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_PlanningUnitDecPOMDPDiscrete.
  super_PlanningUnitMADPDiscrete.super_PlanningUnit._m_problem =
       (MultiAgentDecisionProcessInterface *)sVar2.pi_;
  boost::detail::shared_count::~shared_count(asStack_20);
  PVar3.pn.pi_ = extraout_RDX.pi_;
  PVar3.px = (element_type *)this;
  return PVar3;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstarCluster::NewPPI(const PJPDP_sharedPtr &jp, double v) const
{
    //the index variant can not store a JointPolicyPureVectorForClusteredBG!
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;//We can't delete the joint policy!
    PartialPolicyPoolItemInterface_sharedPtr ppi=boost::make_shared<PartialJPDPValuePair>(jp,v);
    return (ppi);
}